

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int cuddBddAlignToZdd(DdManager *table)

{
  int iVar1;
  int *permutation;
  int index;
  int indexZ;
  int result;
  int i;
  int M;
  int *invperm;
  DdManager *table_local;
  
  if (table->size == 0) {
    table_local._4_4_ = 1;
  }
  else {
    iVar1 = table->sizeZ / table->size;
    if (iVar1 * table->size == table->sizeZ) {
      permutation = (int *)malloc((long)table->size << 2);
      if (permutation == (int *)0x0) {
        table->errorCode = CUDD_MEMORY_OUT;
        table_local._4_4_ = 0;
      }
      else {
        for (indexZ = 0; indexZ < table->sizeZ; indexZ = iVar1 + indexZ) {
          permutation[indexZ / iVar1] = table->invpermZ[indexZ] / iVar1;
        }
        cuddGarbageCollect(table,0);
        table->isolated = 0;
        for (indexZ = 0; indexZ < table->size; indexZ = indexZ + 1) {
          if (table->vars[indexZ]->ref == 1) {
            table->isolated = table->isolated + 1;
          }
        }
        iVar1 = cuddInitInteract(table);
        if (iVar1 == 0) {
          table_local._4_4_ = 0;
        }
        else {
          table_local._4_4_ = ddShuffle(table,permutation);
          if (permutation != (int *)0x0) {
            free(permutation);
          }
          if (table->interact != (long *)0x0) {
            free(table->interact);
            table->interact = (long *)0x0;
          }
          bddFixTree(table,table->tree);
        }
      }
    }
    else {
      table_local._4_4_ = 0;
    }
  }
  return table_local._4_4_;
}

Assistant:

int
cuddBddAlignToZdd(
  DdManager * table /* DD manager */)
{
    int *invperm;               /* permutation array */
    int M;                      /* ratio of ZDD variables to BDD variables */
    int i;                      /* loop index */
    int result;                 /* return value */

    /* We assume that a ratio of 0 is OK. */
    if (table->size == 0)
        return(1);

    M = table->sizeZ / table->size;
    /* Check whether the number of ZDD variables is a multiple of the
    ** number of BDD variables.
    */
    if (M * table->size != table->sizeZ)
        return(0);
    /* Create and initialize the inverse permutation array. */
    invperm = ABC_ALLOC(int,table->size);
    if (invperm == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < table->sizeZ; i += M) {
        int indexZ = table->invpermZ[i];
        int index  = indexZ / M;
        invperm[i / M] = index;
    }
    /* Eliminate dead nodes. Do not scan the cache again, because we
    ** assume that Cudd_zddReduceHeap has already cleared it.
    */
    cuddGarbageCollect(table,0);

    /* Initialize number of isolated projection functions. */
    table->isolated = 0;
    for (i = 0; i < table->size; i++) {
        if (table->vars[i]->ref == 1) table->isolated++;
    }

    /* Initialize the interaction matrix. */
    result = cuddInitInteract(table);
    if (result == 0) return(0);

    result = ddShuffle(table, invperm);
    ABC_FREE(invperm);
    /* Free interaction matrix. */
    ABC_FREE(table->interact);
    /* Fix the BDD variable group tree. */
    bddFixTree(table,table->tree);
    return(result);

}